

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O2

void __thiscall iqxmlrpc::Struct::Struct(Struct *this,Struct *other)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Struct_0019ef70;
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  for_each<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,iqxmlrpc::Value*>>,iqxmlrpc::Struct::Struct_inserter>
            ((other->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>
              )&(other->values)._M_t._M_impl.super__Rb_tree_header,(Struct_inserter)&this->values);
  return;
}

Assistant:

Struct::Struct( const Struct& other )
{
  std::for_each( other.begin(), other.end(), Struct_inserter(&values) );
}